

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

void convert_32s6u_C1R(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  OPJ_INT32 OVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  uVar2 = 0;
  if ((length & 0xfffffffffffffffc) != 0) {
    do {
      uVar3 = pSrc[uVar2 + 1];
      uVar5 = pSrc[uVar2 + 2];
      OVar1 = pSrc[uVar2 + 3];
      *pDst = (byte)(uVar3 >> 4) | (byte)(pSrc[uVar2] << 2);
      pDst[1] = (byte)(uVar5 >> 2) | (byte)(uVar3 << 4);
      pDst[2] = (byte)(uVar5 << 6) | (byte)OVar1;
      pDst = pDst + 3;
      uVar2 = uVar2 + 4;
    } while (uVar2 < (length & 0xfffffffffffffffc));
  }
  if ((length & 3) != 0) {
    uVar3 = 0;
    iVar4 = (int)(length & 3);
    if (iVar4 == 1) {
      uVar5 = 0;
      uVar3 = 0;
    }
    else {
      uVar5 = pSrc[uVar2 + 1];
      if (iVar4 == 3) {
        uVar3 = pSrc[uVar2 + 2];
      }
    }
    *pDst = (byte)(uVar5 >> 4) | (byte)(pSrc[uVar2] << 2);
    if ((iVar4 != 1) && (pDst[1] = (byte)(uVar3 >> 2) | (byte)(uVar5 << 4), iVar4 == 3)) {
      pDst[2] = (char)uVar3 << 6;
    }
  }
  return;
}

Assistant:

static void convert_32s6u_C1R(const OPJ_INT32* pSrc, OPJ_BYTE* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)3U); i+=4U) {
		OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i+0];
		OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i+1];
		OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i+2];
		OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i+3];
		
		*pDst++ = (OPJ_BYTE)((src0 << 2) | (src1 >> 4));
		*pDst++ = (OPJ_BYTE)(((src1 & 0xFU) << 4) | (src2 >> 2));
		*pDst++ = (OPJ_BYTE)(((src2 & 0x3U) << 6) | src3);
	}
	
	if (length & 3U) {
		OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i+0];
		OPJ_UINT32 src1 = 0U;
		OPJ_UINT32 src2 = 0U;
		length = length & 3U;
		
		if (length > 1U) {
			src1 = (OPJ_UINT32)pSrc[i+1];
			if (length > 2U) {
				src2 = (OPJ_UINT32)pSrc[i+2];
			}
		}
		*pDst++ = (OPJ_BYTE)((src0 << 2) | (src1 >> 4));
		if (length > 1U) {
			*pDst++ = (OPJ_BYTE)(((src1 & 0xFU) << 4) | (src2 >> 2));
			if (length > 2U) {
				*pDst++ = (OPJ_BYTE)(((src2 & 0x3U) << 6));
			}
		}
	}
}